

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O0

void __thiscall ASValue::addUser(ASValue *this,uint idx,ASValue *user)

{
  ASValue *local_20;
  ASValue *user_local;
  ASValue *pAStack_10;
  uint idx_local;
  ASValue *this_local;
  
  local_20 = user;
  user_local._4_4_ = idx;
  pAStack_10 = this;
  std::__cxx11::list<ASUse,std::allocator<ASUse>>::emplace_back<ASValue*&,unsigned_int&>
            ((list<ASUse,std::allocator<ASUse>> *)&this->_use,&local_20,
             (uint *)((long)&user_local + 4));
  return;
}

Assistant:

void ASValue::addUser(unsigned int idx, ASValue *user) { _use.emplace_back(user, idx); }